

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jcdctmgr.c
# Opt level: O0

void convsamp(JSAMPARRAY sample_data,JDIMENSION start_col,DCTELEM *workspace)

{
  byte *pbVar1;
  short *psVar2;
  int elemr;
  JSAMPROW elemptr;
  DCTELEM *workspaceptr;
  DCTELEM *workspace_local;
  JDIMENSION start_col_local;
  JSAMPARRAY sample_data_local;
  
  workspaceptr = workspace;
  for (elemr = 0; elemr < 8; elemr = elemr + 1) {
    pbVar1 = sample_data[elemr] + start_col;
    *workspaceptr = *pbVar1 - 0x80;
    workspaceptr[1] = pbVar1[1] - 0x80;
    workspaceptr[2] = pbVar1[2] - 0x80;
    workspaceptr[3] = pbVar1[3] - 0x80;
    workspaceptr[4] = pbVar1[4] - 0x80;
    workspaceptr[5] = pbVar1[5] - 0x80;
    psVar2 = workspaceptr + 7;
    workspaceptr[6] = pbVar1[6] - 0x80;
    workspaceptr = workspaceptr + 8;
    *psVar2 = pbVar1[7] - 0x80;
  }
  return;
}

Assistant:

METHODDEF(void)
convsamp(JSAMPARRAY sample_data, JDIMENSION start_col, DCTELEM *workspace)
{
  register DCTELEM *workspaceptr;
  register JSAMPROW elemptr;
  register int elemr;

  workspaceptr = workspace;
  for (elemr = 0; elemr < DCTSIZE; elemr++) {
    elemptr = sample_data[elemr] + start_col;

#if DCTSIZE == 8                /* unroll the inner loop */
    *workspaceptr++ = (*elemptr++) - CENTERJSAMPLE;
    *workspaceptr++ = (*elemptr++) - CENTERJSAMPLE;
    *workspaceptr++ = (*elemptr++) - CENTERJSAMPLE;
    *workspaceptr++ = (*elemptr++) - CENTERJSAMPLE;
    *workspaceptr++ = (*elemptr++) - CENTERJSAMPLE;
    *workspaceptr++ = (*elemptr++) - CENTERJSAMPLE;
    *workspaceptr++ = (*elemptr++) - CENTERJSAMPLE;
    *workspaceptr++ = (*elemptr++) - CENTERJSAMPLE;
#else
    {
      register int elemc;
      for (elemc = DCTSIZE; elemc > 0; elemc--)
        *workspaceptr++ = (*elemptr++) - CENTERJSAMPLE;
    }
#endif
  }
}